

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O3

int handleroboteqinterface(RS232PORT *pRoboteqInterfacePseudoRS232Port)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  char *pcVar5;
  char *pcVar6;
  double *pdVar7;
  void *__buf;
  ulong uVar8;
  bool bVar9;
  int chan;
  int spd;
  char recvbuf [2048];
  int local_840;
  int local_83c;
  timespec local_838 [128];
  
  local_840 = 0;
  local_83c = 0;
  if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
    local_838[0].tv_sec = 0;
    iVar1 = ioctl(pRoboteqInterfacePseudoRS232Port->s,0x541b,local_838);
    bVar9 = local_838[0].tv_sec == 0;
  }
  else {
    if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_00195399;
    local_838[0].tv_sec = local_838[0].tv_sec & 0xffffffff00000000;
    iVar1 = ioctl(*(int *)&pRoboteqInterfacePseudoRS232Port->hDev,0x541b,local_838);
    bVar9 = (int)local_838[0].tv_sec < 1;
  }
  if ((iVar1 == 0) && (!bVar9)) {
    uVar2 = 0;
    memset(local_838,0,0x800);
    do {
      if (uVar2 != 0) {
        if (*(char *)((long)&local_838[0].tv_sec + (ulong)(uVar2 - 1)) == '\r') {
          pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
          pcVar5 = strchr((char *)local_838,0x3f);
          goto joined_r0x0019546e;
        }
        if (0x7ff < uVar2) {
          return 1;
        }
      }
      __buf = (void *)((long)&local_838[0].tv_sec + (ulong)uVar2);
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        sVar4 = recv(pRoboteqInterfacePseudoRS232Port->s,__buf,1,0);
        iVar1 = (int)sVar4;
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) {
          return 1;
        }
        sVar4 = read(*(int *)&pRoboteqInterfacePseudoRS232Port->hDev,__buf,1);
        iVar1 = (int)sVar4;
      }
      if (iVar1 < 1) {
        return 1;
      }
      uVar2 = iVar1 + uVar2;
    } while( true );
  }
LAB_00195399:
  local_838[0].tv_sec = 0;
  local_838[0].tv_nsec = 50000000;
  nanosleep(local_838,(timespec *)0x0);
  return 0;
joined_r0x0019546e:
  if (pcVar5 == (char *)0x0) goto LAB_001955e1;
  iVar1 = strncmp(pcVar5,"?FID",4);
  if (iVar1 == 0) {
    pcVar6 = strchr(pcVar5,0xd);
    if (pcVar6 == (char *)0x0) goto LAB_001958b6;
    uVar3 = (int)pcVar6 - (int)pcVar5;
    uVar2 = uVar3 + 1;
    if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
      if (uVar3 < 0x7fffffff) {
        iVar1 = pRoboteqInterfacePseudoRS232Port->s;
        uVar8 = 0;
        do {
          sVar4 = send(iVar1,pcVar5 + uVar8,(long)(int)(uVar2 - (int)uVar8),0);
          if ((int)sVar4 < 1) goto LAB_001958b6;
          uVar3 = (int)uVar8 + (int)sVar4;
          uVar8 = (ulong)uVar3;
        } while ((int)uVar3 < (int)uVar2);
      }
    }
    else {
      if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_001958b6;
      if (uVar2 != 0) {
        iVar1 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
        uVar8 = 0;
        do {
          sVar4 = write(iVar1,pcVar5 + uVar8,(ulong)(uVar2 - (int)uVar8));
          if ((int)sVar4 < 1) goto LAB_001958b6;
          uVar3 = (int)uVar8 + (int)sVar4;
          uVar8 = (ulong)uVar3;
        } while (uVar3 < uVar2);
      }
    }
    if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
      iVar1 = pRoboteqInterfacePseudoRS232Port->s;
      uVar8 = 0;
      do {
        sVar4 = send(iVar1,"FID=Roboteq v0.0 EMULATED 12/12/2023\r" + uVar8,
                     (ulong)(0x25 - (int)uVar8),0);
        if ((int)sVar4 < 1) goto LAB_001958b6;
        uVar2 = (int)uVar8 + (int)sVar4;
        uVar8 = (ulong)uVar2;
      } while ((int)uVar2 < 0x25);
    }
    else {
      if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_001958b6;
      iVar1 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
      uVar8 = 0;
      do {
        sVar4 = write(iVar1,"FID=Roboteq v0.0 EMULATED 12/12/2023\r" + uVar8,
                      (ulong)(0x25 - (int)uVar8));
        if ((int)sVar4 < 1) goto LAB_001958b6;
        uVar2 = (int)uVar8 + (int)sVar4;
        uVar8 = (ulong)uVar2;
      } while (uVar2 < 0x25);
    }
  }
  if (0x7fd < (long)local_838 - (long)pcVar5) goto LAB_001955e1;
  pcVar5 = strchr(pcVar5 + 1,0x3f);
  goto joined_r0x0019546e;
LAB_001955e1:
  for (pcVar5 = strchr((char *)local_838,0x21); pcVar5 != (char *)0x0;
      pcVar5 = strchr(pcVar5 + 1,0x21)) {
    iVar1 = __isoc99_sscanf(pcVar5,"!G %d %d",&local_840,&local_83c);
    if ((iVar1 == 2) ||
       (iVar1 = __isoc99_sscanf(pcVar5,"!$00 %d %d",&local_840,&local_83c), iVar1 == 2)) {
      pcVar6 = strchr(pcVar5,0xd);
      if (pcVar6 == (char *)0x0) {
LAB_001958b6:
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        return 1;
      }
      uVar3 = (int)pcVar6 - (int)pcVar5;
      uVar2 = uVar3 + 1;
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        if (uVar3 < 0x7fffffff) {
          iVar1 = pRoboteqInterfacePseudoRS232Port->s;
          uVar8 = 0;
          do {
            sVar4 = send(iVar1,pcVar5 + uVar8,(long)(int)(uVar2 - (int)uVar8),0);
            if ((int)sVar4 < 1) goto LAB_001958b6;
            uVar3 = (int)uVar8 + (int)sVar4;
            uVar8 = (ulong)uVar3;
          } while ((int)uVar3 < (int)uVar2);
        }
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_001958b6;
        if (uVar2 != 0) {
          iVar1 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
          uVar8 = 0;
          do {
            sVar4 = write(iVar1,pcVar5 + uVar8,(ulong)(uVar2 - (int)uVar8));
            if ((int)sVar4 < 1) goto LAB_001958b6;
            uVar3 = (int)uVar8 + (int)sVar4;
            uVar8 = (ulong)uVar3;
          } while (uVar3 < uVar2);
        }
      }
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        iVar1 = pRoboteqInterfacePseudoRS232Port->s;
        uVar2 = 0;
        do {
          sVar4 = send(iVar1,"+\r" + uVar2,(ulong)(2 - uVar2),0);
          if ((int)sVar4 < 1) goto LAB_001958b6;
          uVar2 = uVar2 + (int)sVar4;
        } while ((int)uVar2 < 2);
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_001958b6;
        iVar1 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
        uVar2 = 0;
        do {
          sVar4 = write(iVar1,"+\r" + uVar2,(ulong)(2 - uVar2));
          if ((int)sVar4 < 1) goto LAB_001958b6;
          uVar3 = uVar2 + (int)sVar4;
          uVar2 = 1;
        } while (uVar3 < 2);
      }
      if (robid < 0x8000) {
        if (((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) {
LAB_001957ba:
          pdVar7 = &roboteq_u1;
          if (local_840 == 1) {
LAB_001957d6:
            *pdVar7 = (double)local_83c / 1000.0;
          }
          else if (local_840 == 2) {
            pdVar7 = &roboteq_u2;
            goto LAB_001957d6;
          }
          u = roboteq_u2;
          uw = roboteq_u1;
          goto LAB_0019580e;
        }
      }
      else if (((robid == 0x8000) || (robid == 0x200000)) || (robid == 0x100000)) goto LAB_001957ba;
      pdVar7 = &roboteq_u1;
      if (local_840 == 1) {
LAB_0019585d:
        *pdVar7 = (double)local_83c / 1000.0;
      }
      else if (local_840 == 2) {
        pdVar7 = &roboteq_u2;
        goto LAB_0019585d;
      }
      u = (roboteq_u1 + roboteq_u2) * 0.5;
      uw = (roboteq_u2 - roboteq_u1) * 0.5;
    }
LAB_0019580e:
    if (0x7fd < (long)local_838 - (long)pcVar5) break;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  return 0;
}

Assistant:

int handleroboteqinterface(RS232PORT* pRoboteqInterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_ROBOTEQ, chan = 0, spd = 0;
	char endchar = '\r';
	char* tmp = NULL;
	char* tmp2 = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		// To improve...

		tmp = strstr(recvbuf, "?");
		while (tmp)
		{
			if (strncmp(tmp, "?FID", strlen("?FID")) == 0)
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("FID=Roboteq v0.0 EMULATED 12/12/2023\r"), strlen("FID=Roboteq v0.0 EMULATED 12/12/2023\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "?");
		}

		tmp = strstr(recvbuf, "!");
		while (tmp)
		{
			if ((sscanf(tmp, "!G %d %d", &chan, &spd) == 2)||(sscanf(tmp, "!$00 %d %d", &chan, &spd) == 2))
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("+\r"), strlen("+\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
	
				// Not thread-safe...

				switch (robid)
				{
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case SAILBOAT2_ROBID:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = roboteq_u2;
					uw = roboteq_u1;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
				default:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = (roboteq_u1+roboteq_u2)/2;
					uw = (roboteq_u2-roboteq_u1)/2;
					break;
				}

			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "!");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else 
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}